

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O2

void anon_unknown.dwarf_4cac::Test_TemplateDictionary_SetIntValue::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  _Alloc_hider __haystack;
  bool bVar3;
  char *pcVar4;
  TemplateDictionaryPeer peer;
  string dump;
  TemplateString local_e0;
  TemplateString local_c0;
  TemplateString local_a0;
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString((TemplateString *)&dump,"test_SetIntValue");
  ctemplate::TemplateDictionary::TemplateDictionary
            (&dict,(TemplateString *)&dump,(UnsafeArena *)0x0);
  peer.dict_ = &dict;
  ctemplate::TemplateString::TemplateString(&local_a0,"INT");
  TVar1.length_ = local_a0.length_;
  TVar1.ptr_ = local_a0.ptr_;
  TVar1.is_immutable_ = local_a0.is_immutable_;
  TVar1._17_7_ = local_a0._17_7_;
  TVar1.id_ = local_a0.id_;
  ctemplate::TemplateDictionary::SetIntValue(TVar1,(long)&dict);
  ctemplate::TemplateString::TemplateString(&local_c0,"-INT");
  TVar2.length_ = local_c0.length_;
  TVar2.ptr_ = local_c0.ptr_;
  TVar2.is_immutable_ = local_c0.is_immutable_;
  TVar2._17_7_ = local_c0._17_7_;
  TVar2.id_ = local_c0.id_;
  ctemplate::TemplateDictionary::SetIntValue(TVar2,(long)&dict);
  ctemplate::TemplateString::TemplateString((TemplateString *)&dump,"INT");
  ctemplate::TemplateString::TemplateString(&local_e0,"5");
  bVar3 = ctemplate::TemplateDictionaryPeer::ValueIs(&peer,(TemplateString *)&dump,&local_e0);
  if (bVar3) {
    ctemplate::TemplateString::TemplateString((TemplateString *)&dump,"-INT");
    ctemplate::TemplateString::TemplateString(&local_e0,"-5");
    bVar3 = ctemplate::TemplateDictionaryPeer::ValueIs(&peer,(TemplateString *)&dump,&local_e0);
    if (bVar3) {
      dump._M_dataplus._M_p = (pointer)&dump.field_2;
      dump._M_string_length = 0;
      dump.field_2._M_local_buf[0] = '\0';
      ctemplate::TemplateDictionary::DumpToString((string *)&dict,(int)&dump);
      __haystack._M_p = dump._M_dataplus._M_p;
      pcVar4 = strstr(dump._M_dataplus._M_p,"\n   INT: >5<\n");
      if (pcVar4 == (char *)0x0) {
        printf("%s: %d: ASSERT FAILED: \'%s\' not in \'%s\'\n",
               "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_dictionary_unittest.cc"
               ,0xca,"\n   INT: >5<\n",__haystack._M_p);
        pcVar4 = strstr(dump._M_dataplus._M_p,"\n   INT: >5<\n");
        if (pcVar4 == (char *)0x0) {
          __assert_fail("strstr((dump.c_str()), (\"\\n   INT: >5<\\n\"))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_dictionary_unittest.cc"
                        ,0xca,
                        "static void (anonymous namespace)::Test_TemplateDictionary_SetIntValue::Run()"
                       );
        }
      }
      else {
        pcVar4 = strstr(__haystack._M_p,"\n   -INT: >-5<\n");
        if (pcVar4 != (char *)0x0) {
          std::__cxx11::string::~string((string *)&dump);
          ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
          return;
        }
        printf("%s: %d: ASSERT FAILED: \'%s\' not in \'%s\'\n",
               "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_dictionary_unittest.cc"
               ,0xcb,"\n   -INT: >-5<\n",__haystack._M_p);
        pcVar4 = strstr(dump._M_dataplus._M_p,"\n   -INT: >-5<\n");
        if (pcVar4 == (char *)0x0) {
          __assert_fail("strstr((dump.c_str()), (\"\\n   -INT: >-5<\\n\"))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_dictionary_unittest.cc"
                        ,0xcb,
                        "static void (anonymous namespace)::Test_TemplateDictionary_SetIntValue::Run()"
                       );
        }
      }
      goto LAB_00109970;
    }
    pcVar4 = "peer.ValueIs(\"-INT\", \"-5\")";
  }
  else {
    pcVar4 = "peer.ValueIs(\"INT\", \"5\")";
  }
  fprintf(_stderr,"Check failed: %s\n",pcVar4);
LAB_00109970:
  exit(1);
}

Assistant:

TEST(TemplateDictionary, SetIntValue) {
  TemplateDictionary dict("test_SetIntValue", NULL);
  TemplateDictionaryPeer peer(&dict);

  dict.SetIntValue("INT", 5);
  // - is an illegal varname in templates, but perfectly fine in dicts
  dict.SetIntValue("-INT", -5);

  EXPECT_TRUE(peer.ValueIs("INT", "5"));
  EXPECT_TRUE(peer.ValueIs("-INT", "-5"));
  string dump;
  dict.DumpToString(&dump);
  ASSERT_STRSTR(dump.c_str(), "\n   INT: >5<\n");
  ASSERT_STRSTR(dump.c_str(), "\n   -INT: >-5<\n");

}